

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasmbox.c
# Opt level: O3

int parse_export_section(wasmbox_input_stream_t *ins,wasm_u64_t section_size,wasmbox_module_t *mod)

{
  byte bVar1;
  wasm_u64_t wVar2;
  wasm_u64_t wVar3;
  int iVar4;
  ulong uVar5;
  wasmbox_name_t *local_40;
  wasm_u64_t local_38;
  
  wVar2 = wasmbox_parse_unsigned_leb128(ins->data + ins->index,&ins->index,ins->length);
  if (wVar2 == 0) {
LAB_001049b6:
    iVar4 = 0;
  }
  else {
    parse_name(ins,&local_40);
    bVar1 = wasmbox_input_stream_read_u8(ins);
    if (bVar1 < 4) {
      uVar5 = 0;
      local_38 = wVar2;
      do {
        wVar3 = wasmbox_parse_unsigned_leb128(ins->data + ins->index,&ins->index,ins->length);
        if (bVar1 == 0) {
          mod->functions[wVar3 & 0xffffffff]->name = local_40;
        }
        else {
          wasmbox_free(local_40);
        }
        if (wVar2 - 1 == uVar5) goto LAB_001049b6;
        parse_name(ins,&local_40);
        bVar1 = wasmbox_input_stream_read_u8(ins);
        uVar5 = uVar5 + 1;
      } while (bVar1 < 4);
      iVar4 = -(uint)(uVar5 < local_38);
    }
    else {
      iVar4 = -1;
    }
    fprintf(_stderr,"(%s:%d)unreachable",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/imasahiro[P]wasmbox/src/wasmbox.c"
            ,0x57e);
  }
  return iVar4;
}

Assistant:

static int parse_export_section(wasmbox_input_stream_t *ins,
                                wasm_u64_t section_size,
                                wasmbox_module_t *mod) {
  wasm_u64_t len = wasmbox_parse_unsigned_leb128(ins->data + ins->index,
                                                 &ins->index, ins->length);
  for (wasm_u64_t i = 0; i < len; i++) {
    if (parse_export_entry(ins, mod) != 0) {
      return -1;
    }
  }
  return 0;
}